

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

bool __thiscall
Memory::Recycler::ExplicitFreeInternalWrapper<(Memory::ObjectInfoBits)0>
          (Recycler *this,void *buffer,size_t size)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ConfigFlagsTable *pCVar4;
  size_t sVar5;
  size_t allocSize;
  size_t size_local;
  void *buffer_local;
  Recycler *this_local;
  
  if (buffer == (void *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x484,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if (size == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x485,"(size > 0)","size > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pCVar4 = GetRecyclerFlagsTable(this);
  bVar2 = Js::Phases::IsEnabled(&pCVar4->Off,ExplicitFreePhase);
  if (bVar2) {
    this_local._7_1_ = false;
  }
  else {
    sVar5 = GetAllocSize(this,size);
    bVar2 = HeapInfo::IsSmallObject(sVar5);
    if (bVar2) {
      sVar5 = HeapInfo::GetAlignedSizeNoCheck(sVar5);
      this_local._7_1_ =
           ExplicitFreeInternal<(Memory::ObjectInfoBits)0,SmallAllocationBlockAttributes>
                     (this,buffer,size,sVar5);
    }
    else {
      bVar2 = HeapInfo::IsMediumObject(sVar5);
      if (bVar2) {
        sVar5 = HeapInfo::GetMediumObjectAlignedSizeNoCheck(sVar5);
        this_local._7_1_ =
             ExplicitFreeInternal<(Memory::ObjectInfoBits)0,MediumAllocationBlockAttributes>
                       (this,buffer,size,sVar5);
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool Recycler::ExplicitFreeInternalWrapper(void* buffer, size_t size)
{
    Assert(buffer != nullptr);
    Assert(size > 0);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (CUSTOM_PHASE_OFF1(GetRecyclerFlagsTable(), Js::ExplicitFreePhase))
    {
        return false;
    }
#endif

    size_t allocSize = GetAllocSize(size);

    if (HeapInfo::IsSmallObject(allocSize))
    {
        return ExplicitFreeInternal<attributes, SmallAllocationBlockAttributes>(buffer, size, HeapInfo::GetAlignedSizeNoCheck(allocSize));
    }

    if (HeapInfo::IsMediumObject(allocSize))
    {
        return ExplicitFreeInternal<attributes, MediumAllocationBlockAttributes>(buffer, size, HeapInfo::GetMediumObjectAlignedSizeNoCheck(allocSize));
    }

    return false;
}